

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O0

SampledSpectrum __thiscall
pbrt::NormalizedFresnelBxDF::f
          (NormalizedFresnelBxDF *this,Vector3f wo,Vector3f wi,TransportMode mode)

{
  undefined8 uVar1;
  undefined8 uVar2;
  Vector3f w;
  Vector3f wp;
  Vector3f w_00;
  bool bVar3;
  int in_ESI;
  SampledSpectrum *in_RDI;
  undefined1 in_ZMM0 [64];
  float in_XMM1_Da;
  undefined1 in_ZMM2 [64];
  float in_XMM3_Da;
  Float c;
  SampledSpectrum f;
  Float in_stack_ffffffffffffff3c;
  Float c_00;
  Float eta;
  undefined4 in_stack_ffffffffffffff54;
  array<float,_4> local_10;
  
  uVar1 = vmovlpd_avx(in_ZMM0._0_16_);
  uVar2 = vmovlpd_avx(in_ZMM2._0_16_);
  w_00.super_Tuple3<pbrt::Vector3,_float>.z = in_XMM1_Da;
  w_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  w_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  wp.super_Tuple3<pbrt::Vector3,_float>.z = in_XMM3_Da;
  wp.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar2;
  wp.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar2 >> 0x20);
  bVar3 = SameHemisphere(w_00,wp);
  if (bVar3) {
    c_00 = 1.0;
    FresnelMoment1(1.0 / (in_RDI->values).values[0]);
    eta = (Float)((ulong)uVar2 >> 0x20);
    w.super_Tuple3<pbrt::Vector3,_float>.z = in_XMM3_Da;
    w.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar2;
    w.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar2 >> 0x20);
    CosTheta(w);
    FrDielectric(in_XMM3_Da,eta);
    SampledSpectrum::SampledSpectrum(in_RDI,c_00);
    if (in_ESI == 0) {
      Sqr<float>((in_RDI->values).values[0]);
      SampledSpectrum::operator*=
                ((SampledSpectrum *)CONCAT44(in_stack_ffffffffffffff54,in_XMM3_Da),eta);
    }
  }
  else {
    SampledSpectrum::SampledSpectrum(in_RDI,in_stack_ffffffffffffff3c);
  }
  return (array<float,_4>)(array<float,_4>)local_10.values;
}

Assistant:

f(Vector3f wo, Vector3f wi, TransportMode mode) const {
        if (!SameHemisphere(wo, wi))
            return SampledSpectrum(0.f);
        // Compute $\Sw$ factor for BSSRDF value
        Float c = 1 - 2 * FresnelMoment1(1 / eta);
        SampledSpectrum f((1 - FrDielectric(CosTheta(wi), eta)) / (c * Pi));

        // Update BSSRDF transmission term to account for adjoint light transport
        if (mode == TransportMode::Radiance)
            f *= Sqr(eta);

        return f;
    }